

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

bool __thiscall Json::Value::isInt64(Value *this)

{
  char cVar1;
  bool bVar2;
  double dVar3;
  double integral_part;
  double dStack_8;
  
  cVar1 = this->field_0x8;
  if (cVar1 == '\x01') {
    return true;
  }
  if (cVar1 == '\x03') {
    dVar3 = (this->value_).real_;
    bVar2 = false;
    if ((-9.223372036854776e+18 <= dVar3) && (dVar3 < 9.223372036854776e+18)) {
      dStack_8 = 0.0;
      dVar3 = modf(dVar3,&dStack_8);
      return (bool)(-(dVar3 == 0.0) & 1);
    }
  }
  else {
    if (cVar1 != '\x02') {
      return false;
    }
    bVar2 = -1 < (this->value_).int_;
  }
  return bVar2;
}

Assistant:

bool Value::isInt64() const {
#if defined(JSON_HAS_INT64)
  switch (type_) {
  case intValue:
    return true;
  case uintValue:
    return value_.uint_ <= UInt64(maxInt64);
  case realValue:
    // Note that maxInt64 (= 2^63 - 1) is not exactly representable as a
    // double, so double(maxInt64) will be rounded up to 2^63. Therefore we
    // require the value to be strictly less than the limit.
    return value_.real_ >= double(minInt64) &&
           value_.real_ < double(maxInt64) && IsIntegral(value_.real_);
  default:
    break;
  }
#endif // JSON_HAS_INT64
  return false;
}